

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

wchar_t * archive_entry_symlink_w(archive_entry *entry)

{
  wchar_t wVar1;
  int *piVar2;
  archive_mstring *in_RDI;
  wchar_t *p;
  wchar_t **in_stack_ffffffffffffffe8;
  archive *in_stack_fffffffffffffff8;
  
  if ((in_RDI[1].aes_mbs_in_locale.buffer_length & 2) == 0) {
    in_stack_ffffffffffffffe8 = (wchar_t **)0x0;
  }
  else {
    wVar1 = archive_mstring_get_wcs(in_stack_fffffffffffffff8,in_RDI,in_stack_ffffffffffffffe8);
    if (wVar1 != L'\0') {
      piVar2 = __errno_location();
      if (*piVar2 == 0xc) {
        __archive_errx(p._4_4_,(char *)in_stack_fffffffffffffff8);
      }
      in_stack_ffffffffffffffe8 = (wchar_t **)0x0;
    }
  }
  return (wchar_t *)in_stack_ffffffffffffffe8;
}

Assistant:

const wchar_t *
archive_entry_symlink_w(struct archive_entry *entry)
{
	const wchar_t *p;
	if ((entry->ae_set & AE_SET_SYMLINK) == 0)
		return (NULL);
	if (archive_mstring_get_wcs(
	    entry->archive, &entry->ae_symlink, &p) == 0)
		return (p);
	if (errno == ENOMEM)
		__archive_errx(1, "No memory");
	return (NULL);
}